

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  uint __val;
  uint __len;
  double dVar8;
  string __str;
  Mat image;
  RaspiCam_Cv Camera;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178 [2];
  long local_168 [2];
  void *local_158;
  undefined8 uStack_150;
  long local_148;
  string local_138;
  _InputArray local_118;
  long *local_100;
  long local_f8;
  long local_f0 [10];
  RaspiCam_Cv local_a0 [112];
  
  if (argc == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage (-help for help)",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-help","");
  iVar2 = findParam(&local_138,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 == -1) {
    raspicam::RaspiCam_Cv::RaspiCam_Cv(local_a0);
    processCommandLine(argc,argv,local_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Connecting to camera",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    cVar1 = raspicam::RaspiCam::open(SUB81(local_a0,0));
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error opening camera",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      iVar2 = -1;
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Connected to camera =",0x15);
      raspicam::RaspiCam_Cv::getId_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_100,local_f8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
      cv::Mat::Mat((Mat *)&local_100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Capturing",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      lVar4 = cv::getTickCount();
      __val = 0;
      do {
        raspicam::RaspiCam::grab();
        raspicam::RaspiCam_Cv::retrieve((Mat *)local_a0);
        if (doTestSpeedOnly == false) {
          if ((char)((char)((__val & 0xff) / 5) * -5 + (char)__val) == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\r capturing ...",0xf);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,__val);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
            std::ostream::operator<<(poVar3,100);
            std::ostream::flush();
          }
          if ((__val != 0) && ((char)((char)((__val & 0xff) / 0x1e) * -0x1e + (char)__val) == '\0'))
          {
            __len = 2 - (__val < 10);
            local_178[0] = local_168;
            std::__cxx11::string::_M_construct((ulong)local_178,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_178[0],__len,__val);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_178,0,(char *)0x0,0x104272);
            local_1b8 = &local_1a8;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_1a8 = *plVar7;
              lStack_1a0 = plVar5[3];
            }
            else {
              local_1a8 = *plVar7;
              local_1b8 = (long *)*plVar5;
            }
            local_1b0 = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            local_198 = &local_188;
            plVar7 = plVar5 + 2;
            if ((long *)*plVar5 == plVar7) {
              local_188 = *plVar7;
              lStack_180 = plVar5[3];
            }
            else {
              local_188 = *plVar7;
              local_198 = (long *)*plVar5;
            }
            local_190 = plVar5[1];
            *plVar5 = (long)plVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            local_118.sz.width = 0;
            local_118.sz.height = 0;
            local_118.flags = 0x1010000;
            local_148 = 0;
            local_158 = (void *)0x0;
            uStack_150 = 0;
            local_118.obj = (Mat *)&local_100;
            cv::imwrite((string *)&local_198,&local_118,(vector *)&local_158);
            if (local_158 != (void *)0x0) {
              operator_delete(local_158,local_148 - (long)local_158);
            }
            if (local_198 != &local_188) {
              operator_delete(local_198,local_188 + 1);
            }
            if (local_1b8 != &local_1a8) {
              operator_delete(local_1b8,local_1a8 + 1);
            }
            if (local_178[0] != local_168) {
              operator_delete(local_178[0],local_168[0] + 1);
            }
          }
        }
        __val = __val + 1;
      } while (__val != 100);
      if (doTestSpeedOnly == false) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        poVar3 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Images saved in imagexx.jpg",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      lVar6 = cv::getTickCount();
      dVar8 = (double)cv::getTickFrequency();
      dVar8 = ((double)lVar6 - (double)lVar4) / dVar8;
      poVar3 = std::ostream::_M_insert<double>(dVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds for ",0xd);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  frames : FPS = ",0x11);
      poVar3 = std::ostream::_M_insert<double>((double)(float)(100.0 / dVar8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      raspicam::RaspiCam::release();
      cv::Mat::~Mat((Mat *)&local_100);
      iVar2 = 0;
    }
    raspicam::RaspiCam_Cv::~RaspiCam_Cv(local_a0);
  }
  else {
    showUsage();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main ( int argc,char **argv ) {
    if ( argc==1 ) {
        cerr<<"Usage (-help for help)"<<endl;
    }
    if ( findParam ( "-help",argc,argv ) !=-1 ) {
        showUsage();
        return -1;
    }

    raspicam::RaspiCam_Cv Camera;
    processCommandLine ( argc,argv,Camera );
    cout<<"Connecting to camera"<<endl;
    if ( !Camera.open() ) {
        cerr<<"Error opening camera"<<endl;
        return -1;
    }
    cout<<"Connected to camera ="<<Camera.getId() <<endl;

    cv::Mat image;
    int nCount=100;
    cout<<"Capturing"<<endl;

    double time_=cv::getTickCount();

    for ( int i=0; i<nCount; i++ ) {
        Camera.grab();
        Camera.retrieve ( image );
        if ( !doTestSpeedOnly ) {
            if ( i%5==0 ) 	  cout<<"\r capturing ..."<<i<<"/"<<nCount<<std::flush;
            if ( i%30==0 && i!=0 )
                cv::imwrite ("image"+std::to_string(i)+".jpg",image );
        }
    }
    if ( !doTestSpeedOnly )  cout<<endl<<"Images saved in imagexx.jpg"<<endl;
    double secondsElapsed= double ( cv::getTickCount()-time_ ) /double ( cv::getTickFrequency() ); //time in second
    cout<< secondsElapsed<<" seconds for "<< nCount<<"  frames : FPS = "<< ( float ) ( ( float ) ( nCount ) /secondsElapsed ) <<endl;
    Camera.release();

}